

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<unsigned_char>::addAll<unsigned_char_const*,false>
          (ArrayBuilder<unsigned_char> *this,uchar *start,uchar *end)

{
  uchar *puVar1;
  uchar *end_local;
  uchar *start_local;
  ArrayBuilder<unsigned_char> *this_local;
  
  puVar1 = kj::_::CopyConstructArray_<unsigned_char,_const_unsigned_char_*,_false,_false>::apply
                     (this->pos,start,end);
  this->pos = puVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}